

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::StreamArchive::find_entry(StreamArchive *this,ResourceTag tag,Hash hash,Entry *entry)

{
  undefined8 uVar1;
  bool bVar2;
  const_iterator cVar3;
  Hash local_10;
  
  local_10 = hash;
  if (this->imported_metadata == (ExportedMetadataHeader *)0x0) {
    cVar3 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this->seen_blobs[tag]._M_h,&local_10);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
        ._M_cur != (__node_type *)0x0) {
      uVar1 = *(undefined8 *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                      ._M_cur + 0x20);
      (entry->header).crc = (int)uVar1;
      (entry->header).uncompressed_size = (int)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                      ._M_cur + 0x18);
      entry->offset =
           *(uint64_t *)
            ((long)cVar3.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                   ._M_cur + 0x10);
      (entry->header).payload_size = (int)uVar1;
      (entry->header).format = (int)((ulong)uVar1 >> 0x20);
    }
    return cVar3.
           super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
           ._M_cur != (__node_type *)0x0;
  }
  bVar2 = find_entry_from_metadata(this->imported_metadata,tag,hash,entry);
  return bVar2;
}

Assistant:

bool find_entry(ResourceTag tag, Hash hash, Entry &entry) const
	{
		if (imported_metadata)
		{
			return find_entry_from_metadata(imported_metadata, tag, hash, &entry);
		}
		else
		{
			auto itr = seen_blobs[tag].find(hash);
			if (itr == end(seen_blobs[tag]))
				return false;

			entry = itr->second;
			return true;
		}
	}